

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

void vkt::ubo::anon_unknown_0::generateValueSrc
               (ostringstream *src,UniformLayoutEntry *entry,void *basePtr,int elementNdx)

{
  DataType dataType;
  long lVar1;
  DataType DVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int precision;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int rowNdx;
  int iVar12;
  long lVar13;
  int iVar14;
  string local_50;
  
  DVar2 = glu::getDataTypeScalarType(entry->type);
  uVar3 = glu::getDataTypeScalarSize(entry->type);
  iVar4 = entry->offset;
  iVar5 = 0;
  if (1 < entry->size) {
    iVar5 = elementNdx * entry->arrayStride;
  }
  iVar10 = extraout_EDX;
  if (1 < (int)uVar3) {
    pcVar6 = glu::getDataTypeName(entry->type);
    poVar7 = std::operator<<((ostream *)src,pcVar6);
    std::operator<<(poVar7,"(");
    iVar10 = extraout_EDX_00;
  }
  lVar1 = (long)iVar5 + (long)iVar4;
  dataType = entry->type;
  if (dataType - TYPE_DOUBLE_MAT2 < 9 || dataType - TYPE_FLOAT_MAT2 < 9) {
    iVar4 = glu::getDataTypeMatrixNumRows(dataType);
    iVar5 = glu::getDataTypeMatrixNumColumns(entry->type);
    iVar10 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar10;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    precision = extraout_EDX_01;
    for (; iVar10 != iVar5; iVar10 = iVar10 + 1) {
      iVar9 = 0;
      for (iVar12 = 0; iVar4 != iVar12; iVar12 = iVar12 + 1) {
        if (entry->isRowMajor == true) {
          iVar14 = entry->matrixStride * iVar12 + iVar10 * 4;
        }
        else {
          iVar14 = entry->matrixStride * iVar10 + iVar9;
        }
        if (iVar10 != 0 || iVar12 != 0) {
          std::operator<<((ostream *)src,", ");
          precision = extraout_EDX_02;
        }
        de::floatToString_abi_cxx11_
                  (&local_50,(de *)0x1,*(float *)((long)basePtr + iVar14 + lVar1),precision);
        std::operator<<((ostream *)src,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        iVar9 = iVar9 + 4;
        precision = extraout_EDX_03;
      }
    }
  }
  else {
    lVar13 = 0;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    for (; uVar11 << 2 != lVar13; lVar13 = lVar13 + 4) {
      if (lVar13 != 0) {
        std::operator<<((ostream *)src,", ");
        iVar10 = extraout_EDX_04;
      }
      lVar8 = (long)(int)lVar13;
      if (DVar2 == TYPE_BOOL) {
        pcVar6 = "true";
        poVar7 = (ostream *)src;
        if (*(int *)((long)basePtr + lVar8 + lVar1) == 0) {
          pcVar6 = "false";
        }
LAB_0064a402:
        std::operator<<(poVar7,pcVar6);
        iVar10 = extraout_EDX_07;
      }
      else if (DVar2 == TYPE_INT) {
        std::ostream::operator<<(src,*(int *)((long)basePtr + lVar8 + lVar1));
        iVar10 = extraout_EDX_06;
      }
      else {
        if (DVar2 == TYPE_UINT) {
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)src);
          pcVar6 = "u";
          goto LAB_0064a402;
        }
        if (DVar2 == TYPE_FLOAT) {
          de::floatToString_abi_cxx11_
                    (&local_50,(de *)0x1,*(float *)((long)basePtr + lVar8 + lVar1),iVar10);
          std::operator<<((ostream *)src,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          iVar10 = extraout_EDX_05;
        }
      }
    }
  }
  if (1 < (int)uVar3) {
    std::operator<<((ostream *)src,")");
  }
  return;
}

Assistant:

void generateValueSrc (std::ostringstream& src, const UniformLayoutEntry& entry, const void* basePtr, int elementNdx)
{
	glu::DataType	scalarType		= glu::getDataTypeScalarType(entry.type);
	int				scalarSize		= glu::getDataTypeScalarSize(entry.type);
	bool			isArray			= entry.size > 1;
	const deUint8*	elemPtr			= (const deUint8*)basePtr + entry.offset + (isArray ? elementNdx * entry.arrayStride : 0);
	const int		compSize		= sizeof(deUint32);

	if (scalarSize > 1)
		src << glu::getDataTypeName(entry.type) << "(";

	if (glu::isDataTypeMatrix(entry.type))
	{
		int	numRows	= glu::getDataTypeMatrixNumRows(entry.type);
		int	numCols	= glu::getDataTypeMatrixNumColumns(entry.type);

		DE_ASSERT(scalarType == glu::TYPE_FLOAT);

		// Constructed in column-wise order.
		for (int colNdx = 0; colNdx < numCols; colNdx++)
		{
			for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
			{
				const deUint8*	compPtr	= elemPtr + (entry.isRowMajor ? (rowNdx * entry.matrixStride + colNdx * compSize)
																	  : (colNdx * entry.matrixStride + rowNdx * compSize));

				if (colNdx > 0 || rowNdx > 0)
					src << ", ";

				src << de::floatToString(*((const float*)compPtr), 1);
			}
		}
	}
	else
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		{
			const deUint8* compPtr = elemPtr + scalarNdx * compSize;

			if (scalarNdx > 0)
				src << ", ";

			switch (scalarType)
			{
				case glu::TYPE_FLOAT:	src << de::floatToString(*((const float*)compPtr), 1);			break;
				case glu::TYPE_INT:		src << *((const int*)compPtr);									break;
				case glu::TYPE_UINT:	src << *((const deUint32*)compPtr) << "u";						break;
				case glu::TYPE_BOOL:	src << (*((const deUint32*)compPtr) != 0u ? "true" : "false");	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	if (scalarSize > 1)
		src << ")";
}